

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theory_data.cpp
# Opt level: O0

int __thiscall
Potassco::TheoryData::accept(TheoryData *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  bool bVar1;
  Id_t IVar2;
  iterator pIVar3;
  TheoryElement *pTVar4;
  Id_t *pIVar5;
  undefined7 extraout_var;
  TheoryTerm *pTVar6;
  VisitMode m;
  undefined4 in_register_00000034;
  TheoryAtom *this_00;
  iterator eEnd;
  iterator eIt;
  TheoryAtom *in_stack_ffffffffffffff80;
  Id_t in_stack_ffffffffffffff88;
  VisitMode in_stack_ffffffffffffff8c;
  sockaddr *in_stack_ffffffffffffff90;
  iterator local_28;
  
  this_00 = (TheoryAtom *)CONCAT44(in_register_00000034,__fd);
  m = (VisitMode)__addr_len;
  TheoryAtom::term(this_00);
  bVar1 = doVisitTerm((TheoryData *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
                      in_stack_ffffffffffffff88);
  if (bVar1) {
    IVar2 = TheoryAtom::term(this_00);
    TheoryAtom::term(this_00);
    pTVar6 = getTerm((TheoryData *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    (**(code **)(*(long *)__addr + 0x10))(__addr,this,IVar2,pTVar6);
  }
  local_28 = TheoryAtom::begin(this_00);
  pIVar3 = TheoryAtom::end(in_stack_ffffffffffffff80);
  for (; local_28 != pIVar3; local_28 = local_28 + 1) {
    bVar1 = doVisitElem((TheoryData *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
                        in_stack_ffffffffffffff88);
    if (bVar1) {
      IVar2 = *local_28;
      pTVar4 = getElement((TheoryData *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      (**(code **)(*(long *)__addr + 0x18))(__addr,this,IVar2,pTVar4);
    }
  }
  pIVar5 = TheoryAtom::guard(this_00);
  if (pIVar5 != (Id_t *)0x0) {
    TheoryAtom::guard(this_00);
    bVar1 = doVisitTerm((TheoryData *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
                        in_stack_ffffffffffffff88);
    if (bVar1) {
      in_stack_ffffffffffffff90 = __addr;
      pIVar5 = TheoryAtom::guard(this_00);
      IVar2 = *pIVar5;
      TheoryAtom::guard(this_00);
      pTVar6 = getTerm((TheoryData *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      (**(code **)(*(long *)in_stack_ffffffffffffff90 + 0x10))
                (in_stack_ffffffffffffff90,this,IVar2,pTVar6);
    }
  }
  pIVar5 = TheoryAtom::rhs(this_00);
  if (pIVar5 != (Id_t *)0x0) {
    TheoryAtom::rhs(this_00);
    bVar1 = doVisitTerm((TheoryData *)in_stack_ffffffffffffff90,m,in_stack_ffffffffffffff88);
    pIVar5 = (Id_t *)CONCAT71(extraout_var,bVar1);
    if (bVar1) {
      pIVar5 = TheoryAtom::rhs(this_00);
      IVar2 = *pIVar5;
      TheoryAtom::rhs(this_00);
      pTVar6 = getTerm((TheoryData *)in_stack_ffffffffffffff90,m);
      pIVar5 = (Id_t *)(**(code **)(*(long *)__addr + 0x10))(__addr,this,IVar2,pTVar6);
    }
  }
  return (int)pIVar5;
}

Assistant:

void TheoryData::accept(const TheoryAtom& a, Visitor& out, VisitMode m) const {
	if (doVisitTerm(m, a.term())) { out.visit(*this, a.term(), getTerm(a.term())); }
	for (TheoryElement::iterator eIt = a.begin(), eEnd = a.end(); eIt != eEnd; ++eIt) {
		if (doVisitElem(m, *eIt)) { out.visit(*this, *eIt, getElement(*eIt)); }
	}
	if (a.guard() && doVisitTerm(m, *a.guard())) { out.visit(*this, *a.guard(), getTerm(*a.guard())); }
	if (a.rhs() && doVisitTerm(m, *a.rhs()))     { out.visit(*this, *a.rhs(),   getTerm(*a.rhs())); }
}